

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

wchar_t * ON_wString::ParseHorizontalSpace
                    (wchar_t *s,int len,bool bParseTab,bool bParseNoBreakSpace,
                    bool bParseZeroWidthSpace)

{
  bool bVar1;
  wchar_t *pwVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (len < 1 || s == (wchar_t *)0x0) {
    pwVar2 = (wchar_t *)0x0;
  }
  else {
    uVar4 = 0;
    while ((uVar3 = (ulong)(uint)len, (uint)len != uVar4 &&
           (bVar1 = IsHorizontalSpace(s[uVar4],bParseTab,bParseNoBreakSpace,bParseZeroWidthSpace),
           uVar3 = uVar4, bVar1))) {
      uVar4 = uVar4 + 1;
    }
    pwVar2 = s + uVar3;
  }
  return pwVar2;
}

Assistant:

const wchar_t* ON_wString::ParseHorizontalSpace(const wchar_t* s, int len, bool bParseTab, bool bParseNoBreakSpace, bool bParseZeroWidthSpace)
{
  if (nullptr == s || len <= 0)
    return nullptr;

  int i = 0;
  for (wchar_t c = s[i]; i < len && ON_wString::IsHorizontalSpace(c, bParseTab, bParseNoBreakSpace, bParseZeroWidthSpace); c = s[++i])
  {/*empty body*/
  }

  return s + i;
}